

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O3

ssize_t __thiscall
brynet::net::DataSocket::send(DataSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined8 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  EventLoop *this_01;
  bool bVar2;
  undefined7 extraout_var;
  code *extraout_RAX;
  undefined4 in_register_00000034;
  PACKED_SENDED_CALLBACK callbackCapture;
  _Any_data local_90;
  code *local_80;
  undefined8 uStack_78;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_40;
  code *local_30;
  
  uVar1 = *(undefined8 *)CONCAT44(in_register_00000034,__fd);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_40,(function<void_()> *)__buf);
  this_01 = (this->mEventLoop).
            super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_90,(function<void_()> *)&local_40);
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x38);
  *(DataSocket **)local_68._M_unused._0_8_ = this;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = uVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_68._M_unused._0_8_ + 0x10) =
       this_00;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x28) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x20) = 0;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x30) = uStack_78;
  if (local_80 != (code *)0x0) {
    *(void **)((long)local_68._M_unused._0_8_ + 0x18) = local_90._M_unused._M_object;
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 0x20) = local_90._8_8_;
    *(code **)((long)local_68._M_unused._0_8_ + 0x28) = local_80;
    local_80 = (code *)0x0;
    uStack_78 = 0;
  }
  pcStack_50 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:128:31)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp:128:31)>
             ::_M_manager;
  EventLoop::pushAsyncProc(this_01,(USER_PROC *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    bVar2 = (*local_30)(&local_40,&local_40,__destroy_functor);
    local_30 = (code *)CONCAT71(extraout_var,bVar2);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    local_30 = extraout_RAX;
  }
  return (ssize_t)local_30;
}

Assistant:

void DataSocket::send(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    auto packetCapture = packet;
    auto callbackCapture = callback;
    mEventLoop->pushAsyncProc([this, packetCapture, callbackCapture](){
        auto len = packetCapture->size();
        mSendList.push_back({ std::move(packetCapture), len, std::move(callbackCapture) });
        runAfterFlush();
    });
}